

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

bool __thiscall
TPZMatrix<Fad<float>_>::SolveEigensystemJacobi
          (TPZMatrix<Fad<float>_> *this,int64_t *numiterations,REAL *tol,
          TPZVec<Fad<float>_> *Eigenvalues,TPZFMatrix<Fad<float>_> *Eigenvectors)

{
  int64_t row;
  TPZFMatrix<Fad<float>_> *pTVar1;
  bool bVar2;
  int iVar3;
  Fad<float> *pFVar4;
  Fad<float> *this_00;
  int64_t j;
  long lVar5;
  int64_t iVar6;
  long lVar7;
  int64_t i;
  long lVar8;
  bool bVar9;
  double local_7e8;
  undefined1 local_7c0 [32];
  Fad<float> exp_1;
  undefined1 local_778 [16];
  float *local_768;
  float local_760;
  Fad<float> *local_758;
  Fad<float> *local_750;
  float *local_748;
  float local_740;
  undefined1 local_738 [16];
  TPZFMatrix<Fad<float>_> *local_720;
  long local_718;
  undefined1 local_710 [16];
  float *local_700;
  REAL local_6f8;
  FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_> local_6f0;
  Fad<float> local_6e0;
  Fad<float> exp;
  Fad<float> local_6a0;
  TPZFNMatrix<9,_Fad<float>_> Matrix_1;
  Fad<float> answ;
  TPZFNMatrix<3,_Fad<float>_> VecIni_cp;
  TPZFNMatrix<3,_Fad<float>_> VecIni;
  TPZFNMatrix<9,_Fad<float>_> Matrix;
  
  local_700 = (float *)*numiterations;
  local_6f8 = *tol;
  row = (this->super_TPZBaseMatrix).fRow;
  local_720 = Eigenvectors;
  TPZFNMatrix<9,_Fad<float>_>::TPZFNMatrix(&Matrix,row,row);
  lVar7 = 0;
  lVar8 = 0;
  if (0 < row) {
    lVar8 = row;
  }
  for (; lVar7 != lVar8; lVar7 = lVar7 + 1) {
    for (lVar5 = 0; row != lVar5; lVar5 = lVar5 + 1) {
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])
                (&Matrix_1,this,lVar7,lVar5);
      pFVar4 = TPZFMatrix<Fad<float>_>::operator()
                         (&Matrix.super_TPZFMatrix<Fad<float>_>,lVar7,lVar5);
      Fad<float>::operator=(pFVar4,(Fad<float> *)&Matrix_1);
      Fad<float>::~Fad((Fad<float> *)&Matrix_1);
    }
  }
  bVar2 = SolveEigenvaluesJacobi((TPZMatrix<Fad<float>_> *)&Matrix,numiterations,tol,Eigenvalues);
  if (bVar2) {
    Matrix_1.super_TPZFMatrix<Fad<float>_>.super_TPZMatrix<Fad<float>_>.super_TPZBaseMatrix.
    super_TPZSavable._vptr_TPZSavable._0_4_ = 0.0;
    Matrix_1.super_TPZFMatrix<Fad<float>_>.super_TPZMatrix<Fad<float>_>.super_TPZBaseMatrix.fRow.
    _0_4_ = 0;
    Matrix_1.super_TPZFMatrix<Fad<float>_>.super_TPZMatrix<Fad<float>_>.super_TPZBaseMatrix.fCol = 0
    ;
    Matrix_1.super_TPZFMatrix<Fad<float>_>.super_TPZMatrix<Fad<float>_>.super_TPZBaseMatrix.
    fDecomposed = '\0';
    Matrix_1.super_TPZFMatrix<Fad<float>_>.super_TPZMatrix<Fad<float>_>.super_TPZBaseMatrix.
    fDefPositive = '\0';
    Matrix_1.super_TPZFMatrix<Fad<float>_>.super_TPZMatrix<Fad<float>_>.super_TPZBaseMatrix._26_2_ =
         0;
    TPZFNMatrix<3,_Fad<float>_>::TPZFNMatrix(&VecIni,row,1,(Fad<float> *)&Matrix_1);
    Fad<float>::~Fad((Fad<float> *)&Matrix_1);
    Matrix_1.super_TPZFMatrix<Fad<float>_>.super_TPZMatrix<Fad<float>_>.super_TPZBaseMatrix.
    super_TPZSavable._vptr_TPZSavable._0_4_ = 0.0;
    Matrix_1.super_TPZFMatrix<Fad<float>_>.super_TPZMatrix<Fad<float>_>.super_TPZBaseMatrix.fRow.
    _0_4_ = 0;
    Matrix_1.super_TPZFMatrix<Fad<float>_>.super_TPZMatrix<Fad<float>_>.super_TPZBaseMatrix.fCol = 0
    ;
    Matrix_1.super_TPZFMatrix<Fad<float>_>.super_TPZMatrix<Fad<float>_>.super_TPZBaseMatrix.
    fDecomposed = '\0';
    Matrix_1.super_TPZFMatrix<Fad<float>_>.super_TPZMatrix<Fad<float>_>.super_TPZBaseMatrix.
    fDefPositive = '\0';
    Matrix_1.super_TPZFMatrix<Fad<float>_>.super_TPZMatrix<Fad<float>_>.super_TPZBaseMatrix._26_2_ =
         0;
    TPZFNMatrix<3,_Fad<float>_>::TPZFNMatrix(&VecIni_cp,row,1,(Fad<float> *)&Matrix_1);
    Fad<float>::~Fad((Fad<float> *)&Matrix_1);
    pTVar1 = local_720;
    (*(local_720->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable[0xd])(local_720,row,row);
    (*(pTVar1->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
      [0xf])(pTVar1);
    for (lVar7 = 0; lVar7 != lVar8; lVar7 = lVar7 + 1) {
      lVar5 = 0;
      iVar6 = row;
      while( true ) {
        bVar9 = iVar6 == 0;
        iVar6 = iVar6 + -1;
        if (bVar9) break;
        iVar3 = rand();
        Matrix_1.super_TPZFMatrix<Fad<float>_>.super_TPZMatrix<Fad<float>_>.super_TPZBaseMatrix.
        super_TPZSavable._vptr_TPZSavable._0_4_ = (float)iVar3;
        Matrix_1.super_TPZFMatrix<Fad<float>_>.super_TPZMatrix<Fad<float>_>.super_TPZBaseMatrix.fRow
        ._0_4_ = 0;
        Matrix_1.super_TPZFMatrix<Fad<float>_>.super_TPZMatrix<Fad<float>_>.super_TPZBaseMatrix.fCol
             = 0;
        Matrix_1.super_TPZFMatrix<Fad<float>_>.super_TPZMatrix<Fad<float>_>.super_TPZBaseMatrix.
        fDecomposed = '\0';
        Matrix_1.super_TPZFMatrix<Fad<float>_>.super_TPZMatrix<Fad<float>_>.super_TPZBaseMatrix.
        fDefPositive = '\0';
        Matrix_1.super_TPZFMatrix<Fad<float>_>.super_TPZMatrix<Fad<float>_>.super_TPZBaseMatrix.
        _26_2_ = 0;
        Fad<float>::operator=
                  ((Fad<float> *)((long)&(VecIni.super_TPZFMatrix<Fad<float>_>.fElem)->val_ + lVar5)
                   ,(Fad<float> *)&Matrix_1);
        Fad<float>::~Fad((Fad<float> *)&Matrix_1);
        lVar5 = lVar5 + 0x20;
      }
      TPZFMatrix<Fad<float>_>::TPZFMatrix((TPZFMatrix<Fad<float>_> *)&answ,this);
      TPZFNMatrix<9,_Fad<float>_>::TPZFNMatrix(&Matrix_1,(TPZFMatrix<Fad<float>_> *)&answ);
      TPZFMatrix<Fad<float>_>::~TPZFMatrix((TPZFMatrix<Fad<float>_> *)&answ);
      Fad<float>::Fad(&local_6a0,Eigenvalues->fStore + lVar7);
      local_6e0.val_ = 1e-05;
      local_6e0.dx_.num_elts = 0;
      local_6e0.dx_.ptr_to_data = (float *)0x0;
      local_6e0.defaultVal = 0.0;
      ReturnNearestValue(&answ,&local_6a0,Eigenvalues,&local_6e0);
      Fad<float>::~Fad(&local_6e0);
      Fad<float>::~Fad(&local_6a0);
      exp_1.dx_._0_8_ = Eigenvalues->fStore + lVar7;
      exp_1._0_8_ = &answ;
      Fad<float>::Fad<FadBinaryMinus<Fad<float>,Fad<float>>>
                (&exp,(FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_> *)&exp_1);
      if (ABS(exp.val_) <= 1e-05) {
        for (lVar5 = 0; row != lVar5; lVar5 = lVar5 + 1) {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    ((Fad<float> *)local_7c0,this,lVar5,lVar5);
          local_758 = (Fad<float> *)CONCAT44(local_758._4_4_,0x3c23d70a);
          local_750 = (Fad<float> *)((ulong)local_750 & 0xffffffff00000000);
          local_748 = (float *)0x0;
          local_710._0_8_ = Eigenvalues->fStore + lVar7;
          local_740 = 0.0;
          local_710._8_8_ = &local_758;
          local_778._8_8_ = local_710;
          local_778._0_8_ = (Fad<float> *)local_7c0;
          Fad<float>::Fad<FadBinaryMinus<Fad<float>,FadExpr<FadBinaryMinus<Fad<float>,Fad<float>>>>>
                    (&exp_1,(FadExpr<FadBinaryMinus<Fad<float>,_FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_>_>_>
                             *)local_778);
          TPZFMatrix<Fad<float>_>::PutVal
                    (&Matrix_1.super_TPZFMatrix<Fad<float>_>,lVar5,lVar5,&exp_1);
          Fad<float>::~Fad(&exp_1);
          Fad<float>::~Fad((Fad<float> *)&local_758);
          Fad<float>::~Fad((Fad<float> *)local_7c0);
        }
      }
      else {
        for (lVar5 = 0; row != lVar5; lVar5 = lVar5 + 1) {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (local_7c0,this,lVar5,lVar5);
          local_778._0_4_ = ABS(exp.val_) * 0.01;
          local_778._8_8_ = local_778._8_8_ & 0xffffffff00000000;
          local_768 = (float *)0x0;
          local_760 = 0.0;
          local_6f0.fadexpr_.left_ = Eigenvalues->fStore + lVar7;
          local_6f0.fadexpr_.right_ = (Fad<float> *)local_778;
          Fad<float>::Fad<FadBinaryMinus<Fad<float>,Fad<float>>>
                    ((Fad<float> *)&local_758,&local_6f0);
          local_710._0_8_ = local_7c0;
          local_710._8_8_ = (Fad<float> *)&local_758;
          Fad<float>::Fad<FadBinaryMinus<Fad<float>,Fad<float>>>
                    (&exp_1,(FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_> *)local_710);
          TPZFMatrix<Fad<float>_>::PutVal
                    (&Matrix_1.super_TPZFMatrix<Fad<float>_>,lVar5,lVar5,&exp_1);
          Fad<float>::~Fad(&exp_1);
          Fad<float>::~Fad((Fad<float> *)&local_758);
          Fad<float>::~Fad((Fad<float> *)local_778);
          Fad<float>::~Fad((Fad<float> *)local_7c0);
        }
      }
      local_7e8 = 0.0;
      for (lVar5 = 0; lVar8 != lVar5; lVar5 = lVar5 + 1) {
        pFVar4 = TPZFMatrix<Fad<float>_>::operator()(&VecIni.super_TPZFMatrix<Fad<float>_>,lVar5,0);
        local_738 = ZEXT416((uint)pFVar4->val_);
        pFVar4 = TPZFMatrix<Fad<float>_>::operator()(&VecIni.super_TPZFMatrix<Fad<float>_>,lVar5,0);
        local_7e8 = local_7e8 + (double)ABS((float)local_738._0_4_ * pFVar4->val_);
      }
      if (local_7e8 < 0.0) {
        local_7e8 = sqrt(local_7e8);
      }
      else {
        local_7e8 = SQRT(local_7e8);
      }
      for (lVar5 = 0; lVar8 != lVar5; lVar5 = lVar5 + 1) {
        local_7c0._0_8_ =
             TPZFMatrix<Fad<float>_>::operator()(&VecIni.super_TPZFMatrix<Fad<float>_>,lVar5,0);
        exp_1.val_ = (float)local_7e8;
        exp_1.dx_._0_8_ = exp_1.dx_._0_8_ & 0xffffffff00000000;
        exp_1.dx_.ptr_to_data = (float *)0x0;
        exp_1.defaultVal = 0.0;
        local_7c0._8_8_ = &exp_1;
        pFVar4 = TPZFMatrix<Fad<float>_>::operator()(&VecIni.super_TPZFMatrix<Fad<float>_>,lVar5,0);
        Fad<float>::operator=(pFVar4,(FadExpr<FadBinaryDiv<Fad<float>,_Fad<float>_>_> *)local_7c0);
        Fad<float>::~Fad(&exp_1);
      }
      local_7e8 = 10.0;
      for (local_718 = 0; (local_6f8 < local_7e8 && (local_718 <= (long)local_700));
          local_718 = local_718 + 1) {
        for (lVar5 = 0; lVar8 != lVar5; lVar5 = lVar5 + 1) {
          pFVar4 = TPZFMatrix<Fad<float>_>::operator()
                             (&VecIni.super_TPZFMatrix<Fad<float>_>,lVar5,0);
          this_00 = TPZFMatrix<Fad<float>_>::operator()
                              (&VecIni_cp.super_TPZFMatrix<Fad<float>_>,lVar5,0);
          Fad<float>::operator=(this_00,pFVar4);
        }
        Solve_LU((TPZMatrix<Fad<float>_> *)&Matrix_1,&VecIni.super_TPZFMatrix<Fad<float>_>);
        local_7e8 = 0.0;
        for (lVar5 = 0; lVar8 != lVar5; lVar5 = lVar5 + 1) {
          pFVar4 = TPZFMatrix<Fad<float>_>::operator()
                             (&VecIni.super_TPZFMatrix<Fad<float>_>,lVar5,0);
          local_738 = ZEXT416((uint)pFVar4->val_);
          pFVar4 = TPZFMatrix<Fad<float>_>::operator()
                             (&VecIni.super_TPZFMatrix<Fad<float>_>,lVar5,0);
          local_7e8 = local_7e8 + (double)ABS((float)local_738._0_4_ * pFVar4->val_);
        }
        if (local_7e8 < 0.0) {
          local_7e8 = sqrt(local_7e8);
        }
        else {
          local_7e8 = SQRT(local_7e8);
        }
        local_738._0_4_ = (float)local_7e8;
        local_7e8 = 0.0;
        for (lVar5 = 0; lVar8 != lVar5; lVar5 = lVar5 + 1) {
          local_7c0._0_8_ =
               TPZFMatrix<Fad<float>_>::operator()(&VecIni.super_TPZFMatrix<Fad<float>_>,lVar5,0);
          exp_1.val_ = (float)local_738._0_4_;
          exp_1.dx_._0_8_ = exp_1.dx_._0_8_ & 0xffffffff00000000;
          exp_1.dx_.ptr_to_data = (float *)0x0;
          exp_1.defaultVal = 0.0;
          local_7c0._8_8_ = &exp_1;
          pFVar4 = TPZFMatrix<Fad<float>_>::operator()
                             (&VecIni.super_TPZFMatrix<Fad<float>_>,lVar5,0);
          Fad<float>::operator=(pFVar4,(FadExpr<FadBinaryDiv<Fad<float>,_Fad<float>_>_> *)local_7c0)
          ;
          Fad<float>::~Fad(&exp_1);
          pFVar4 = TPZFMatrix<Fad<float>_>::operator()
                             (&VecIni_cp.super_TPZFMatrix<Fad<float>_>,lVar5,0);
          local_750 = TPZFMatrix<Fad<float>_>::operator()
                                (&VecIni.super_TPZFMatrix<Fad<float>_>,lVar5,0);
          local_758 = pFVar4;
          pFVar4 = TPZFMatrix<Fad<float>_>::operator()
                             (&VecIni_cp.super_TPZFMatrix<Fad<float>_>,lVar5,0);
          local_778._8_8_ =
               TPZFMatrix<Fad<float>_>::operator()(&VecIni.super_TPZFMatrix<Fad<float>_>,lVar5,0);
          local_7c0._0_8_ = &local_758;
          local_7c0._8_8_ = local_778;
          local_778._0_8_ = pFVar4;
          Fad<float>::
          Fad<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<float>,Fad<float>>>,FadExpr<FadBinaryMinus<Fad<float>,Fad<float>>>>>
                    (&exp_1,(FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_>,_FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_>_>_>
                             *)local_7c0);
          local_7e8 = local_7e8 + (double)ABS(exp_1.val_);
          Fad<float>::~Fad(&exp_1);
        }
        if (local_7e8 < 0.0) {
          local_7e8 = sqrt(local_7e8);
        }
        else {
          local_7e8 = SQRT(local_7e8);
        }
      }
      for (lVar5 = 0; lVar8 != lVar5; lVar5 = lVar5 + 1) {
        pFVar4 = TPZFMatrix<Fad<float>_>::operator()(&VecIni.super_TPZFMatrix<Fad<float>_>,lVar5,0);
        Fad<float>::Fad(&exp_1,pFVar4);
        if (ABS(exp_1.val_) < 1e-05) {
          local_7c0._0_8_ = (Fad<float> *)0x0;
          Fad<float>::operator=<double,_nullptr>(&exp_1,(double *)local_7c0);
        }
        pFVar4 = TPZFMatrix<Fad<float>_>::operator()(local_720,lVar7,lVar5);
        Fad<float>::operator=(pFVar4,&exp_1);
        Fad<float>::~Fad(&exp_1);
      }
      Fad<float>::~Fad(&exp);
      Fad<float>::~Fad(&answ);
      TPZFNMatrix<9,_Fad<float>_>::~TPZFNMatrix(&Matrix_1);
    }
    TPZFNMatrix<3,_Fad<float>_>::~TPZFNMatrix(&VecIni_cp);
    TPZFNMatrix<3,_Fad<float>_>::~TPZFNMatrix(&VecIni);
  }
  TPZFNMatrix<9,_Fad<float>_>::~TPZFNMatrix(&Matrix);
  return bVar2;
}

Assistant:

bool TPZMatrix<TVar>::SolveEigensystemJacobi(int64_t &numiterations, REAL & tol, TPZVec<TVar> & Eigenvalues, TPZFMatrix<TVar> & Eigenvectors) const{
	
	int64_t NumIt = numiterations;
	REAL tolerance = tol;
	
#ifdef PZDEBUG2
	if (this->Rows() != this->Cols())
	{
		PZError << __PRETTY_FUNCTION__ <<
		" - Jacobi method of computing eigensystem requires a symmetric square matrix. this->Rows = " << this->Rows() << " - this->Cols() = " << this->Cols() << endl;
		return false;
	}
	
	if (this->VerifySymmetry(1.e-8) == false)
	{
		PZError << __PRETTY_FUNCTION__ <<
		" - Jacobi method of computing eigensystem requires a symmetric square matrix. This matrix is not symmetric." << endl;
		return false;
	}
#endif
	
	const int64_t size = this->Rows();
	
	/** Making a copy of this */
	TPZFNMatrix<9,TVar> Matrix(size,size); //fast constructor in case of this is a stress or strain tensor.
	for(int64_t i = 0; i < size; i++) for(int64_t j = 0; j < size; j++) Matrix(i,j) = this->Get(i,j);
	
	/** Compute Eigenvalues *//////////////////////////////////////
	bool result = Matrix.SolveEigenvaluesJacobi(numiterations, tol, &Eigenvalues);
	if (result == false) return false;
	
	/** Compute Eigenvectors *//////////////////////////////////////
	TPZFNMatrix<3, TVar> VecIni(size,1,0.), VecIni_cp(size,1,0.);
	
	Eigenvectors.Resize(size, size);
	Eigenvectors.Zero();
	for(int64_t eigen = 0; eigen < size; eigen++)
	{
        for(int64_t i = 0; i < size; i++) VecIni.PutVal(i,0,rand());
		
        TPZFNMatrix<9,TVar> Matrix(*this);
		
        TVar answ = ReturnNearestValue(Eigenvalues[eigen], Eigenvalues,((TVar)1.E-5));
        TVar exp = answ - Eigenvalues[eigen];
        if((REAL)(fabs(exp)) > 1.E-5)
        {
            for(int64_t i = 0; i < size; i++) Matrix.PutVal(i,i, this->GetVal(i,i) - (TVar)(Eigenvalues[eigen] - (TVar)(0.01 * fabs(exp))) );
        }
        else
        {
            for(int64_t i = 0; i < size; i++) Matrix.PutVal(i,i, this->GetVal(i,i) - (Eigenvalues[eigen] - TVar(0.01)) );
        }
		
        /** Normalizing Initial Eigenvec */
        REAL norm1 = 0.;
        for(int64_t i = 0; i < size; i++) norm1 += fabs(VecIni(i,0)) * fabs(VecIni(i,0)); norm1 = sqrt(norm1);
        for(int64_t i = 0; i < size; i++) VecIni(i,0) = VecIni(i,0)/(TVar)norm1;
		
        int64_t count = 0;
        double dif = 10., difTemp = 0.;
		
        while(dif > tolerance && count <= NumIt)
        {
			for(int64_t i = 0; i < size; i++) VecIni_cp(i,0) = VecIni(i,0);
			
			/** Estimating Eigenvec */
			Matrix.Solve_LU(&VecIni);
			
			/** Normalizing Final Eigenvec */
			REAL norm2 = 0.;
			for(int64_t i = 0; i < size; i++) norm2 += fabs(VecIni(i,0)) * fabs(VecIni(i,0));
			norm2 = sqrt(norm2);
			
			difTemp = 0.;
			for(int64_t i = 0; i < size; i++)
			{
                VecIni(i,0) = VecIni(i,0)/(TVar)norm2;
                TVar exp = (VecIni_cp(i,0) - VecIni(i,0)) * (VecIni_cp(i,0) - VecIni(i,0));
                difTemp += fabs(exp);
			}
			dif = sqrt(difTemp);
			count++;
        }
		
        /** Copy values from AuxVector to Eigenvectors */
        for(int64_t i = 0; i < size; i++)
        {
			TVar val = VecIni(i,0);
			if((REAL)(fabs(val)) < 1.E-5) val = 0.;
			Eigenvectors(eigen,i) = val;
        }
		
#ifdef PZDEBUG2
        double norm = 0.;
        for(int64_t i = 0; i < size; i++) norm += fabs(VecIni(i,0)) * fabs(VecIni(i,0));
        if (fabs(norm - 1.) > 1.e-10)
        {
            PZError << __PRETTY_FUNCTION__ << endl;
        }
        if(count > NumIt-1)// O metodo nao convergiu !!!
        {
            PZError << __PRETTY_FUNCTION__ << endl;
#ifdef PZ_LOG
            {
                std::stringstream sout;
                Print("Matrix for SolveEigensystemJacobi did not converge",sout);
                LOGPZ_DEBUG(logger,sout.str());
            }
#endif
        }
#endif
	}
	
	return true;
	
}